

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::BP5Reader::BP5Reader
          (BP5Reader *this,IO *io,string *name,Mode mode,Comm *comm,char *md,size_t mdsize)

{
  Comm *comm_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  ScopedTimer __var255;
  Comm local_80;
  ScopedTimer local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  string *local_60;
  JSONProfiler *local_58;
  string local_50;
  
  (this->super_BP5Engine).m_RankMPI = 0;
  (this->super_BP5Engine).m_MetadataIndexTable._M_h._M_buckets =
       &(this->super_BP5Engine).m_MetadataIndexTable._M_h._M_single_bucket;
  (this->super_BP5Engine).m_MetadataIndexTable._M_h._M_bucket_count = 1;
  (this->super_BP5Engine).m_MetadataIndexTable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_BP5Engine).m_MetadataIndexTable._M_h._M_element_count = 0;
  (this->super_BP5Engine).m_MetadataIndexTable._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_BP5Engine).m_MetadataIndexTable._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_BP5Engine).m_MetadataIndexTable._M_h._M_single_bucket = (__node_base_ptr)0x0;
  adios2::format::BufferSTL::BufferSTL(&(this->super_BP5Engine).m_MetadataIndex);
  (this->super_BP5Engine).UseBufferV = ChunkVType;
  (this->super_BP5Engine).m_Parameters.BurstBufferPath._M_dataplus._M_p =
       (pointer)&(this->super_BP5Engine).m_Parameters.BurstBufferPath.field_2;
  (this->super_BP5Engine).m_Parameters.BurstBufferPath._M_string_length = 0;
  (this->super_BP5Engine).m_Parameters.BurstBufferPath.field_2._M_local_buf[0] = '\0';
  (this->super_BP5Engine).m_Parameters.SelectSteps._M_dataplus._M_p =
       (pointer)&(this->super_BP5Engine).m_Parameters.SelectSteps.field_2;
  (this->super_BP5Engine).m_Parameters.SelectSteps._M_string_length = 0;
  (this->super_BP5Engine).m_Parameters.SelectSteps.field_2._M_local_buf[0] = '\0';
  (this->super_BP5Engine).m_Parameters.RemoteDataPath._M_dataplus._M_p =
       (pointer)&(this->super_BP5Engine).m_Parameters.RemoteDataPath.field_2;
  (this->super_BP5Engine).m_Parameters.RemoteDataPath._M_string_length = 0;
  (this->super_BP5Engine).m_Parameters.RemoteDataPath.field_2._M_local_buf[0] = '\0';
  (this->super_BP5Engine).m_Parameters.RemoteHost._M_dataplus._M_p =
       (pointer)&(this->super_BP5Engine).m_Parameters.RemoteHost.field_2;
  (this->super_BP5Engine).m_Parameters.RemoteHost._M_string_length = 0;
  (this->super_BP5Engine).m_Parameters.RemoteHost.field_2._M_local_buf[0] = '\0';
  (this->super_BP5Engine).m_Parameters.UUID._M_dataplus._M_p =
       (pointer)&(this->super_BP5Engine).m_Parameters.UUID.field_2;
  (this->super_BP5Engine).m_Parameters.UUID._M_string_length = 0;
  (this->super_BP5Engine).m_Parameters.UUID.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"BP5Reader","");
  helper::Comm::Comm(&local_80,comm);
  Engine::Engine(&this->super_Engine,&local_50,io,name,mode,&local_80);
  helper::Comm::~Comm(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__BP5Reader_0086d7d8;
  this->m_BP5Deserializer = (BP5Deserializer *)0x0;
  comm_00 = &(this->super_Engine).m_Comm;
  transportman::TransportMan::TransportMan(&this->m_MDFileManager,io,comm_00);
  this->m_MDFileAlreadyReadSize = 0;
  this->m_MDFileProcessedSize = 0;
  this->m_MDFileAbsolutePos = 0;
  transportman::TransportMan::TransportMan(&this->m_DataFileManager,io,comm_00);
  transportman::TransportMan::TransportMan(&this->m_MDIndexFileManager,io,comm_00);
  transportman::TransportMan::TransportMan(&this->m_FileMetaMetadataManager,io,comm_00);
  this->m_MDIndexFileAlreadyReadSize = 0;
  this->m_MetaMetaDataFileAlreadyReadSize = 0;
  this->m_MetaMetaDataFileAlreadyProcessedSize = 0;
  transportman::TransportMan::TransportMan(&this->m_ActiveFlagFileManager,io,comm_00);
  this->m_dataIsRemote = false;
  (this->m_Remote)._M_t.super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>.
  _M_t.super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
  super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl = (Remote *)0x0;
  this->m_WriterIsActive = true;
  profiling::JSONProfiler::JSONProfiler(&this->m_JSONProfiler,comm_00);
  (this->MinBlocksInfoMap)._M_h._M_buckets = &(this->MinBlocksInfoMap)._M_h._M_single_bucket;
  (this->MinBlocksInfoMap)._M_h._M_bucket_count = 1;
  (this->MinBlocksInfoMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->MinBlocksInfoMap)._M_h._M_element_count = 0;
  (this->MinBlocksInfoMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->MinBlocksInfoMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->MinBlocksInfoMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  paVar1 = &(this->m_Fingerprint).field_2;
  (this->m_Fingerprint)._M_dataplus._M_p = (pointer)paVar1;
  local_58 = &this->m_JSONProfiler;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_Fingerprint,"");
  this->m_AbsStepsInFile = 0;
  this->m_LastMapStep = 0;
  this->m_CurrentStep = 0;
  this->m_StepsCount = 0;
  this->m_LastWriterCount = 0;
  this->m_FirstStep = true;
  (this->m_SelectedSteps).m_Selection.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_SelectedSteps).m_Selection.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->m_SelectedSteps).m_Selection.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_SelectedSteps).m_Selection.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_70 = &(this->m_Minifooter).VersionTag.field_2;
  (this->m_SelectedSteps).m_Selection.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->m_SelectedSteps).m_UnlimitedRules.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SelectedSteps).m_UnlimitedRules.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SelectedSteps).m_UnlimitedRules.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_FilteredMetadataInfo).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_FilteredMetadataInfo).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_FilteredMetadataInfo).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_Minifooter).VersionTag._M_dataplus._M_p = (pointer)local_70;
  (this->m_Minifooter).VersionTag._M_string_length = 0;
  (this->m_Minifooter).VersionTag.field_2._M_local_buf[0] = '\0';
  (this->m_Minifooter).PGIndexStart = 0;
  (this->m_Minifooter).VarsIndexStart = 0;
  (this->m_Minifooter).AttributesIndexStart = 0;
  (this->m_Minifooter).Version = -1;
  (this->m_Minifooter).IsLittleEndian = true;
  (this->m_Minifooter).HasSubFiles = false;
  this->m_InitialWriterActiveCheckDone = false;
  this->m_ReadMetadataFromFile = true;
  this->m_WriterColumnMajor = 0;
  this->m_ReaderIsRowMajor = true;
  this->m_WriterIsRowMajor = true;
  this->m_FlattenSteps = false;
  local_68 = paVar1;
  local_60 = &this->m_Fingerprint;
  adios2::format::BufferSTL::BufferSTL(&this->m_MetadataIndex);
  adios2::format::BufferSTL::BufferSTL(&this->m_MetaMetadata);
  adios2::format::BufferMalloc::BufferMalloc(&this->m_Metadata);
  p_Var2 = &(this->m_WriterMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_WriterMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_WriterMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_WriterMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_WriterMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_WriterMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_WriterMapIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_WriterMapIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_WriterMapIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  helper::Comm::Comm(&this->m_NodeComm);
  helper::Comm::Comm(&this->singleComm);
  (this->fileManagers).
  super__Vector_base<adios2::transportman::TransportMan,_std::allocator<adios2::transportman::TransportMan>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fileManagers).
  super__Vector_base<adios2::transportman::TransportMan,_std::allocator<adios2::transportman::TransportMan>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fileManagers).
  super__Vector_base<adios2::transportman::TransportMan,_std::allocator<adios2::transportman::TransportMan>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (BP5Reader(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
      ::__var55 == '\0') {
    iVar3 = __cxa_guard_acquire(&BP5Reader(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
                                 ::__var55);
    if (iVar3 != 0) {
      BP5Reader::__var55 = (void *)ps_timer_create_("BP5Reader::Open");
      __cxa_guard_release(&BP5Reader(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
                           ::__var55);
    }
  }
  local_78.m_timer = BP5Reader::__var55;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  this->m_ReadMetadataFromFile = false;
  (*(this->super_Engine)._vptr_Engine[0x15])(this);
  ProcessMetadataFromMemory(this,md);
  (this->super_Engine).m_IsOpen = true;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_78);
  return;
}

Assistant:

BP5Reader::BP5Reader(IO &io, const std::string &name, const Mode mode, helper::Comm comm,
                     const char *md, const size_t mdsize)
: Engine("BP5Reader", io, name, mode, std::move(comm)), m_MDFileManager(io, m_Comm),
  m_DataFileManager(io, m_Comm), m_MDIndexFileManager(io, m_Comm),
  m_FileMetaMetadataManager(io, m_Comm), m_ActiveFlagFileManager(io, m_Comm), m_Remote(),
  m_JSONProfiler(m_Comm)
{
    PERFSTUBS_SCOPED_TIMER("BP5Reader::Open");
    m_ReadMetadataFromFile = false;
    Init();
    ProcessMetadataFromMemory(md);
    m_IsOpen = true;
}